

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O0

void __thiscall PyreNet::NeuralNet::add(NeuralNet *this,LayerDefinition *newLayer)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  Activation *local_30;
  Activation *activation;
  ActivationFactory *pAStack_20;
  int prevSize;
  ActivationFactory *activationFactory;
  LayerDefinition *newLayer_local;
  NeuralNet *this_local;
  
  activationFactory = (ActivationFactory *)newLayer;
  newLayer_local = (LayerDefinition *)this;
  pAStack_20 = ActivationFactory::getInstance();
  sVar2 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::size(&this->layers);
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::reserve(&this->layers,sVar2 + 1);
  bVar1 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::empty(&this->layers);
  if (bVar1) {
    activation._4_4_ = this->inputSize;
  }
  else {
    this_00 = std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::back(&this->layers);
    activation._4_4_ = Layer::size(this_00);
  }
  local_30 = ActivationFactory::getActivation
                       (pAStack_20,
                        *(activationType *)&(activationFactory->activationCache)._M_h._M_buckets);
  std::vector<PyreNet::Layer,std::allocator<PyreNet::Layer>>::
  emplace_back<int_const&,int&,PyreNet::Activation*&>
            ((vector<PyreNet::Layer,std::allocator<PyreNet::Layer>> *)&this->layers,
             (int *)((long)&(activationFactory->activationCache)._M_h._M_buckets + 4),
             (int *)((long)&activation + 4),&local_30);
  return;
}

Assistant:

void NeuralNet::add(const LayerDefinition &newLayer){

        ActivationFactory* activationFactory = ActivationFactory::getInstance();

        this->layers.reserve(this->layers.size() + 1);
        int prevSize;
        if (this->layers.empty()) prevSize = this->inputSize;
        else prevSize = this->layers.back().size();

        Activation* activation = activationFactory->getActivation(newLayer.activation);
        this->layers.emplace_back(newLayer.size, prevSize, activation);
    }